

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.t.cpp
# Opt level: O2

exception_ptr anon_unknown.dwarf_22b8c::make_ep(void)

{
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at(&local_30,1);
  std::__cxx11::string::~string((string *)&local_30);
  *in_RDI = 0;
  return (exception_ptr)in_RDI;
}

Assistant:

std::exception_ptr make_ep()
{
    try
    {
        // this generates an std::out_of_range:
        (void) std::string().at(1);
    }
    catch(...)
    {
        return std::current_exception();
    }
    return nullptr;
}